

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O0

state_type __thiscall
estl::state_machine<cdplayer>::next_state
          (state_machine<cdplayer> *this,state_type state,inputs_type *inputs)

{
  bool bVar1;
  state_type sVar2;
  state_not_found *this_00;
  undefined1 local_40 [8];
  switch_state_fun fn;
  inputs_type *inputs_local;
  state_type state_local;
  state_machine<cdplayer> *this_local;
  
  fn._M_invoker = (_Invoker_type)inputs;
  get_switch_state_function((switch_state_fun *)local_40,this,state);
  bVar1 = std::function::operator_cast_to_bool((function *)local_40);
  if (!bVar1) {
    this_00 = (state_not_found *)__cxa_allocate_exception(8);
    *this_00 = (state_not_found)0x0;
    state_not_found::state_not_found(this_00);
    __cxa_throw(this_00,&state_not_found::typeinfo,state_not_found::~state_not_found);
  }
  sVar2 = std::function<cdplayer::state_type_(const_cdplayer::inputs_type_&)>::operator()
                    ((function<cdplayer::state_type_(const_cdplayer::inputs_type_&)> *)local_40,
                     (inputs_type *)fn._M_invoker);
  std::function<cdplayer::state_type_(const_cdplayer::inputs_type_&)>::~function
            ((function<cdplayer::state_type_(const_cdplayer::inputs_type_&)> *)local_40);
  return sVar2;
}

Assistant:

state_type next_state(state_type state, const inputs_type& inputs) const {
        const auto fn = get_switch_state_function(state);
        if (!fn) {
            throw state_not_found{};
        }
        return fn(inputs);
    }